

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall
Session::setAsymmetricCryptoOp(Session *this,AsymmetricAlgorithm *inAsymmetricCryptoOp)

{
  CryptoFactory *pCVar1;
  Session *in_RSI;
  PublicKey *in_RDI;
  
  if (in_RDI[0xc].super_Serialisable._vptr_Serialisable != (_func_int **)0x0) {
    setPublicKey(in_RSI,in_RDI);
    setPrivateKey(in_RSI,(PrivateKey *)in_RDI);
    pCVar1 = CryptoFactory::i();
    (*pCVar1->_vptr_CryptoFactory[3])(pCVar1,in_RDI[0xc].super_Serialisable._vptr_Serialisable);
  }
  in_RDI[0xc].super_Serialisable._vptr_Serialisable = (_func_int **)in_RSI;
  return;
}

Assistant:

void Session::setAsymmetricCryptoOp(AsymmetricAlgorithm *inAsymmetricCryptoOp)
{
	if (asymmetricCryptoOp != NULL)
	{
		setPublicKey(NULL);
		setPrivateKey(NULL);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(asymmetricCryptoOp);
	}

	asymmetricCryptoOp = inAsymmetricCryptoOp;
}